

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

pair<std::pair<sjtu::orderType,_long>_*,_long> __thiscall
sjtu::FileManager<std::pair<sjtu::orderType,_long>_>::newspace
          (FileManager<std::pair<sjtu::orderType,_long>_> *this)

{
  long in_RDI;
  pair<std::pair<sjtu::orderType,_long>_*,_long> pVar1;
  LRUCache<std::pair<sjtu::orderType,_long>_> *unaff_retaddr;
  locType offset;
  pair<sjtu::orderType,_long> tmp;
  long *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar2;
  fpos local_f0 [16];
  streamoff local_e0;
  undefined1 local_d8 [200];
  locType *local_10;
  locType *offset_00;
  
  uVar2 = 0;
  offset_00 = local_10;
  std::ostream::seekp(in_RDI + 0x18,_S_beg);
  std::ios::clear(in_RDI + 8 + *(long *)(*(long *)(in_RDI + 8) + -0x18),uVar2);
  std::pair<sjtu::orderType,_long>::pair<sjtu::orderType,_long,_true>
            ((pair<sjtu::orderType,_long> *)CONCAT44(uVar2,in_stack_fffffffffffffee0));
  local_f0 = (fpos  [16])std::ostream::tellp();
  local_e0 = std::fpos::operator_cast_to_long(local_f0);
  std::ostream::write((char *)(in_RDI + 0x18),(long)local_d8);
  LRUCache<std::pair<sjtu::orderType,_long>_>::load(unaff_retaddr,offset_00);
  pVar1 = std::make_pair<std::pair<sjtu::orderType,long>*,long&>
                    ((pair<sjtu::orderType,_long> **)CONCAT44(uVar2,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffed8);
  return pVar1;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}